

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_aug.c
# Opt level: O3

int parse_png_file(png *z,int scan,int req_comp)

{
  uint8 **ppuVar1;
  FILE *pFVar2;
  undefined8 uVar3;
  uint uVar4;
  uint32 uVar5;
  uint32 uVar6;
  int iVar7;
  uint uVar8;
  size_t __size;
  size_t sVar9;
  uint7 uVar11;
  uint8 *puVar10;
  uint uVar12;
  byte bVar13;
  int iVar14;
  uint uVar15;
  uint8 *puVar16;
  uint uVar17;
  uint8 *puVar18;
  byte bVar19;
  ulong uVar20;
  byte bVar21;
  uint uVar22;
  long lVar23;
  uint8 *puVar24;
  byte *pbVar25;
  long lVar26;
  undefined8 uVar27;
  ulong uVar28;
  bool bVar29;
  bool bVar30;
  bool bVar31;
  bool bVar32;
  uint8 tc [3];
  uint32 raw_len;
  uint8 palette [1024];
  uint8 local_4a3 [3];
  ulong local_4a0;
  int local_498;
  uint local_494;
  ulong local_490;
  long local_488;
  undefined8 local_480;
  uint local_474;
  long local_470;
  long local_468;
  undefined8 local_460;
  int local_454;
  long local_450;
  ulong local_448;
  long local_440;
  uint8 auStack_438 [1032];
  
  lVar26 = 0;
  do {
    uVar4 = get8(&z->s);
    if (uVar4 != (byte)(&check_png_header_png_sig)[lVar26]) {
      failure_reason = "Not a PNG";
      return 0;
    }
    lVar26 = lVar26 + 1;
  } while (lVar26 != 8);
  if (scan == 1) {
    return 1;
  }
  local_490 = CONCAT44(local_490._4_4_,scan);
  uVar5 = get32(&z->s);
  uVar6 = get32(&z->s);
  if (uVar6 == 0x49484452) {
    bVar29 = true;
    uVar27 = 0;
    uVar8 = 0x49484452;
    local_480 = 0;
    uVar4 = 0;
    uVar15 = 0;
    uVar22 = 0;
    local_494 = req_comp;
    do {
      uVar20 = (ulong)uVar5;
      if ((int)uVar8 < 0x504c5445) {
        if (uVar8 == 0x49444154) {
          if (((char)uVar27 != '\0') && (uVar22 == 0)) break;
          uVar8 = uVar4 + uVar5;
          if (uVar15 < uVar8) {
            sVar9 = 0x1000;
            if (0x1000 < uVar5) {
              sVar9 = uVar20;
            }
            if (uVar15 != 0) {
              sVar9 = (ulong)uVar15;
            }
            do {
              __size = sVar9;
              uVar15 = (uint)__size;
              sVar9 = (ulong)(uVar15 * 2);
            } while (uVar15 < uVar8);
            puVar10 = (uint8 *)realloc(z->idata,__size);
            if (puVar10 == (uint8 *)0x0) goto LAB_00157454;
            z->idata = puVar10;
          }
          pFVar2 = (FILE *)(z->s).img_file;
          if (pFVar2 == (FILE *)0x0) {
            memcpy(z->idata + uVar4,(z->s).img_buffer,uVar20);
            ppuVar1 = &(z->s).img_buffer;
            *ppuVar1 = *ppuVar1 + uVar20;
            uVar4 = uVar8;
          }
          else {
            sVar9 = fread(z->idata + uVar4,1,uVar20,pFVar2);
            uVar4 = uVar8;
            if (sVar9 != uVar20) break;
          }
        }
        else if (uVar8 == 0x49484452) {
          if ((!bVar29) || (uVar5 != 0xd)) break;
          uVar5 = get32(&z->s);
          (z->s).img_x = uVar5;
          if (0x1000000 < uVar5) {
LAB_00156bf4:
            failure_reason = "Very large image (corrupt?)";
            return 0;
          }
          uVar5 = get32(&z->s);
          (z->s).img_y = uVar5;
          if (0x1000000 < uVar5) goto LAB_00156bf4;
          iVar7 = get8(&z->s);
          if (iVar7 != 8) {
            failure_reason = "PNG not supported: 8-bit only";
            return 0;
          }
          uVar8 = get8(&z->s);
          if ((6 < (int)uVar8) ||
             ((((uVar3 = 3, uVar8 != 3 && (uVar3 = uVar27, (uVar8 & 1) != 0)) ||
               (uVar27 = uVar3, iVar7 = get8(&z->s), iVar7 != 0)) ||
              (iVar7 = get8(&z->s), iVar7 != 0)))) break;
          iVar7 = get8(&z->s);
          if (iVar7 != 0) {
            failure_reason = "PNG not supported: interlaced mode";
            return 0;
          }
          uVar17 = (z->s).img_x;
          if ((uVar17 == 0) || (uVar12 = (z->s).img_y, uVar12 == 0)) break;
          if ((char)uVar27 == '\0') {
            uVar8 = (uVar8 & 2) + (uVar8 >> 2 & 1) + 1;
            (z->s).img_n = uVar8;
            uVar27 = 0;
            if ((uint)((0x40000000 / (ulong)uVar17) / (ulong)uVar8) < uVar12) {
              failure_reason = "Image too large to decode";
              return 0;
            }
          }
          else {
            (z->s).img_n = 1;
            if ((uint)(0x40000000 / (ulong)uVar17 >> 2) < uVar12) break;
          }
        }
        else {
          if (uVar8 == 0x49454e44) {
            if ((int)local_490 != 0) {
              return 1;
            }
            if (z->idata != (uint8 *)0x0) {
              local_460 = uVar27;
              puVar10 = (uint8 *)stbi_zlib_decode_malloc_guesssize
                                           ((char *)z->idata,uVar4,0x4000,&local_454);
              z->expanded = puVar10;
              if (puVar10 == (uint8 *)0x0) {
                return 0;
              }
              free(z->idata);
              z->idata = (uint8 *)0x0;
              uVar4 = (z->s).img_n;
              lVar26 = (long)(int)uVar4;
              uVar8 = uVar4 + 1;
              bVar29 = uVar8 != local_494;
              bVar30 = local_494 == 3;
              bVar31 = (char)local_460 != '\0';
              bVar32 = (char)local_480 == '\0';
              if (bVar32 && ((bVar31 || bVar30) || bVar29)) {
                uVar8 = uVar4;
              }
              (z->s).img_out_n = uVar8;
              pbVar25 = z->expanded;
              local_490 = CONCAT44(local_490._4_4_,local_454);
              uVar5 = (z->s).img_x;
              uVar6 = (z->s).img_y;
              local_474 = uVar5 * uVar8;
              puVar10 = (uint8 *)malloc((ulong)(uVar6 * local_474));
              z->out = puVar10;
              if (puVar10 == (uint8 *)0x0) {
                failure_reason = "Out of memory";
                return 0;
              }
              if ((uVar5 * uVar4 + 1) * uVar6 != (int)local_490) {
                failure_reason = "Corrupt PNG";
                return 0;
              }
              if (uVar6 == 0) {
                uVar8 = 0;
              }
              else {
                local_490 = (ulong)uVar4;
                local_468 = (long)(int)uVar8;
                uVar28 = (ulong)uVar8;
                local_488 = local_468 - lVar26;
                local_440 = local_488 - (ulong)local_474;
                local_470 = -(ulong)local_474;
                uVar15 = 0;
                uVar20 = 0;
                do {
                  local_448 = uVar20;
                  bVar13 = *pbVar25;
                  if (4 < (ulong)bVar13) {
                    failure_reason = "Corrupt PNG";
                    return 0;
                  }
                  if (local_448 == 0) {
                    bVar13 = ""[bVar13];
                  }
                  local_4a0 = (ulong)uVar15;
                  puVar10 = z->out;
                  if (0 < (int)uVar4) {
                    uVar20 = 0;
                    do {
                      switch(bVar13) {
                      case 0:
                      case 1:
                      case 5:
                      case 6:
                        bVar19 = pbVar25[uVar20 + 1];
                        goto LAB_00156db5;
                      case 2:
                      case 4:
                        bVar19 = puVar10[uVar20 + local_470 + local_4a0];
                        break;
                      case 3:
                        bVar19 = puVar10[uVar20 + local_470 + local_4a0] >> 1;
                        break;
                      default:
                        goto switchD_00156d98_default;
                      }
                      bVar19 = bVar19 + pbVar25[uVar20 + 1];
LAB_00156db5:
                      puVar10[uVar20 + local_4a0] = bVar19;
switchD_00156d98_default:
                      uVar20 = uVar20 + 1;
                    } while (local_490 != uVar20);
                  }
                  uVar8 = local_474 * (int)local_448;
                  if (bVar32 && ((bVar31 || bVar30) || bVar29)) {
                    pbVar25 = pbVar25 + lVar26 + 1;
                    if (bVar13 < 7) {
                      puVar18 = puVar10 + local_468 + (ulong)uVar8;
                      puVar16 = puVar10 + local_468 + local_470 + (ulong)uVar8;
                      switch(bVar13) {
                      case 0:
                        uVar5 = (z->s).img_x;
                        while (uVar5 = uVar5 - 1, uVar5 != 0) {
                          if (0 < (int)uVar4) {
                            uVar20 = 0;
                            do {
                              puVar18[uVar20] = pbVar25[uVar20];
                              uVar20 = uVar20 + 1;
                            } while (uVar28 != uVar20);
                          }
                          pbVar25 = pbVar25 + lVar26;
                          puVar18 = puVar18 + lVar26;
                        }
                        break;
                      case 1:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0 + local_488;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                puVar18[uVar20] = puVar10[uVar20] + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (uVar28 != uVar20);
                            }
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + lVar26;
                            puVar10 = puVar10 + lVar26;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                        break;
                      case 2:
                        uVar5 = (z->s).img_x;
                        while (uVar5 = uVar5 - 1, uVar5 != 0) {
                          if (0 < (int)uVar4) {
                            uVar20 = 0;
                            do {
                              puVar18[uVar20] = puVar16[uVar20] + pbVar25[uVar20];
                              uVar20 = uVar20 + 1;
                            } while (uVar28 != uVar20);
                          }
                          pbVar25 = pbVar25 + lVar26;
                          puVar18 = puVar18 + lVar26;
                          puVar16 = puVar16 + lVar26;
                        }
                        break;
                      case 3:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0 + local_488;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                puVar18[uVar20] =
                                     (char)((uint)puVar10[uVar20] + (uint)puVar16[uVar20] >> 1) +
                                     pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (uVar28 != uVar20);
                            }
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + lVar26;
                            puVar16 = puVar16 + lVar26;
                            puVar10 = puVar10 + lVar26;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                        break;
                      case 4:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar24 = puVar10 + local_4a0 + local_440;
                          puVar10 = puVar10 + local_4a0 + local_488;
                          local_498 = iVar7;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                bVar13 = puVar10[uVar20];
                                bVar19 = puVar16[uVar20];
                                bVar21 = puVar24[uVar20];
                                iVar7 = ((uint)bVar19 + (uint)bVar13) - (uint)bVar21;
                                uVar22 = iVar7 - (uint)bVar13;
                                uVar8 = -uVar22;
                                if (0 < (int)uVar22) {
                                  uVar8 = uVar22;
                                }
                                uVar17 = iVar7 - (uint)bVar19;
                                uVar22 = -uVar17;
                                if (0 < (int)uVar17) {
                                  uVar22 = uVar17;
                                }
                                uVar12 = iVar7 - (uint)bVar21;
                                uVar17 = -uVar12;
                                if (0 < (int)uVar12) {
                                  uVar17 = uVar12;
                                }
                                if (uVar22 <= uVar17) {
                                  bVar21 = bVar19;
                                }
                                if (uVar17 < uVar8) {
                                  bVar13 = bVar21;
                                }
                                if (uVar22 < uVar8) {
                                  bVar13 = bVar21;
                                }
                                puVar18[uVar20] = bVar13 + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (uVar28 != uVar20);
                            }
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + lVar26;
                            puVar16 = puVar16 + lVar26;
                            puVar24 = puVar24 + lVar26;
                            puVar10 = puVar10 + lVar26;
                            local_498 = local_498 + -1;
                          } while (local_498 != 0);
                          local_498 = 0;
                        }
                        break;
                      case 5:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0 + local_488;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                puVar18[uVar20] = (puVar10[uVar20] >> 1) + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (uVar28 != uVar20);
                            }
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + lVar26;
                            puVar10 = puVar10 + lVar26;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                        break;
                      case 6:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0 + local_488;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                puVar18[uVar20] = puVar10[uVar20] + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (uVar28 != uVar20);
                            }
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + lVar26;
                            puVar10 = puVar10 + lVar26;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                      }
                    }
                  }
                  else {
                    puVar10[lVar26 + (ulong)uVar8] = 0xff;
                    pbVar25 = pbVar25 + lVar26 + 1;
                    if (bVar13 < 7) {
                      puVar18 = puVar10 + local_468 + (ulong)uVar8;
                      puVar16 = puVar10 + local_468 + local_470 + (ulong)uVar8;
                      switch(bVar13) {
                      case 0:
                        uVar5 = (z->s).img_x;
                        while (uVar5 = uVar5 - 1, uVar5 != 0) {
                          if (0 < (int)uVar4) {
                            uVar20 = 0;
                            do {
                              puVar18[uVar20] = pbVar25[uVar20];
                              uVar20 = uVar20 + 1;
                            } while (local_490 != uVar20);
                          }
                          puVar18[lVar26] = 0xff;
                          pbVar25 = pbVar25 + lVar26;
                          puVar18 = puVar18 + local_468;
                        }
                        break;
                      case 1:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                puVar18[uVar20] = puVar10[uVar20] + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (local_490 != uVar20);
                            }
                            puVar18[lVar26] = 0xff;
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + local_468;
                            puVar10 = puVar10 + local_468;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                        break;
                      case 2:
                        uVar5 = (z->s).img_x;
                        while (uVar5 = uVar5 - 1, uVar5 != 0) {
                          if (0 < (int)uVar4) {
                            uVar20 = 0;
                            do {
                              puVar18[uVar20] = puVar18[uVar20 + local_470] + pbVar25[uVar20];
                              uVar20 = uVar20 + 1;
                            } while (local_490 != uVar20);
                          }
                          puVar18[lVar26] = 0xff;
                          pbVar25 = pbVar25 + lVar26;
                          puVar18 = puVar18 + local_468;
                        }
                        break;
                      case 3:
                        uVar5 = (z->s).img_x;
                        while (uVar5 = uVar5 - 1, uVar5 != 0) {
                          if (0 < (int)uVar4) {
                            uVar20 = 0;
                            do {
                              puVar18[uVar20] =
                                   (char)((uint)puVar18[uVar20 - local_468] + (uint)puVar16[uVar20]
                                         >> 1) + pbVar25[uVar20];
                              uVar20 = uVar20 + 1;
                            } while (uVar20 != local_490);
                          }
                          puVar18[lVar26] = 0xff;
                          pbVar25 = pbVar25 + lVar26;
                          puVar18 = puVar18 + local_468;
                          puVar16 = puVar16 + local_468;
                        }
                        break;
                      case 4:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0;
                          lVar23 = (long)puVar10 + local_470;
                          local_498 = iVar7;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                bVar13 = puVar10[uVar20];
                                bVar19 = puVar16[uVar20];
                                bVar21 = *(byte *)(lVar23 + uVar20);
                                iVar7 = ((uint)bVar19 + (uint)bVar13) - (uint)bVar21;
                                uVar22 = iVar7 - (uint)bVar13;
                                uVar8 = -uVar22;
                                if (0 < (int)uVar22) {
                                  uVar8 = uVar22;
                                }
                                uVar17 = iVar7 - (uint)bVar19;
                                uVar22 = -uVar17;
                                if (0 < (int)uVar17) {
                                  uVar22 = uVar17;
                                }
                                uVar12 = iVar7 - (uint)bVar21;
                                uVar17 = -uVar12;
                                if (0 < (int)uVar12) {
                                  uVar17 = uVar12;
                                }
                                if (uVar22 <= uVar17) {
                                  bVar21 = bVar19;
                                }
                                if (uVar17 < uVar8) {
                                  bVar13 = bVar21;
                                }
                                if (uVar22 < uVar8) {
                                  bVar13 = bVar21;
                                }
                                puVar18[uVar20] = bVar13 + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (local_490 != uVar20);
                            }
                            puVar18[lVar26] = 0xff;
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + local_468;
                            puVar16 = puVar16 + local_468;
                            lVar23 = lVar23 + local_468;
                            puVar10 = puVar10 + local_468;
                            local_498 = local_498 + -1;
                          } while (local_498 != 0);
                          local_498 = 0;
                        }
                        break;
                      case 5:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                puVar18[uVar20] = (puVar10[uVar20] >> 1) + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (local_490 != uVar20);
                            }
                            puVar18[lVar26] = 0xff;
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + local_468;
                            puVar10 = puVar10 + local_468;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                        break;
                      case 6:
                        iVar7 = (z->s).img_x - 1;
                        if (iVar7 != 0) {
                          puVar10 = puVar10 + local_4a0;
                          do {
                            if (0 < (int)uVar4) {
                              uVar20 = 0;
                              do {
                                puVar18[uVar20] = puVar10[uVar20] + pbVar25[uVar20];
                                uVar20 = uVar20 + 1;
                              } while (local_490 != uVar20);
                            }
                            puVar18[lVar26] = 0xff;
                            pbVar25 = pbVar25 + lVar26;
                            puVar18 = puVar18 + local_468;
                            puVar10 = puVar10 + local_468;
                            iVar7 = iVar7 + -1;
                          } while (iVar7 != 0);
                        }
                      }
                    }
                  }
                  uVar8 = (z->s).img_y;
                  uVar15 = uVar15 + local_474;
                  uVar20 = local_448 + 1;
                  local_450 = lVar26;
                } while (local_448 + 1 < (ulong)uVar8);
              }
              if ((char)local_480 != '\0') {
                iVar7 = (z->s).img_out_n;
                iVar14 = uVar8 * (z->s).img_x;
                puVar10 = z->out;
                if (iVar7 == 2) {
                  if (iVar14 != 0) {
                    lVar26 = 0;
                    do {
                      puVar10[lVar26 * 2 + 1] = -(puVar10[lVar26 * 2] != local_4a3[0]);
                      lVar26 = lVar26 + 1;
                    } while (iVar14 != (int)lVar26);
                  }
                }
                else {
                  if (iVar7 != 4) {
                    __assert_fail("out_n == 2 || out_n == 4",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/meruiden[P]CS3D/external/soil/src/stb_image_aug.c"
                                  ,0x86d,"int compute_transparency(png *, uint8 *, int)");
                  }
                  if (iVar14 != 0) {
                    lVar26 = 0;
                    do {
                      if (((puVar10[lVar26 * 4] == local_4a3[0]) &&
                          (puVar10[lVar26 * 4 + 1] == local_4a3[1])) &&
                         (puVar10[lVar26 * 4 + 2] == local_4a3[2])) {
                        puVar10[lVar26 * 4 + 3] = '\0';
                      }
                      lVar26 = lVar26 + 1;
                    } while (iVar14 != (int)lVar26);
                  }
                }
              }
              if ((char)local_460 != '\0') {
                uVar4 = (uint)local_460 & 0xff;
                (z->s).img_n = uVar4;
                if (2 < (int)local_494) {
                  uVar4 = local_494;
                }
                (z->s).img_out_n = uVar4;
                uVar8 = (z->s).img_y * (z->s).img_x;
                puVar10 = z->out;
                puVar16 = (uint8 *)malloc((ulong)(uVar8 * uVar4));
                if (puVar16 == (uint8 *)0x0) {
LAB_00157454:
                  failure_reason = "Out of memory";
                  return 0;
                }
                if (uVar4 == 3) {
                  if (uVar8 != 0) {
                    uVar20 = 0;
                    puVar18 = puVar16;
                    do {
                      uVar28 = (ulong)puVar10[uVar20];
                      *puVar18 = auStack_438[uVar28 * 4];
                      puVar18[1] = auStack_438[uVar28 * 4 + 1];
                      puVar18[2] = auStack_438[uVar28 * 4 + 2];
                      puVar18 = puVar18 + 3;
                      uVar20 = uVar20 + 1;
                    } while (uVar8 != uVar20);
                  }
                }
                else if (uVar8 != 0) {
                  uVar20 = 0;
                  do {
                    *(undefined4 *)(puVar16 + uVar20 * 4) =
                         *(undefined4 *)(auStack_438 + (ulong)puVar10[uVar20] * 4);
                    uVar20 = uVar20 + 1;
                  } while (uVar8 != uVar20);
                }
                free(puVar10);
                z->out = puVar16;
              }
              free(z->expanded);
              z->expanded = (uint8 *)0x0;
              return 1;
            }
            break;
          }
LAB_00156af2:
          if ((uVar8 >> 0x1d & 1) == 0) {
            failure_reason = "PNG not supported: unknown chunk type";
            return 0;
          }
          pFVar2 = (FILE *)(z->s).img_file;
          if (pFVar2 == (FILE *)0x0) {
            ppuVar1 = &(z->s).img_buffer;
            *ppuVar1 = *ppuVar1 + (int)uVar5;
          }
          else {
            fseek(pFVar2,(long)(int)uVar5,1);
          }
        }
      }
      else if (uVar8 == 0x504c5445) {
        if ((0x300 < uVar5) || (uVar22 = (uVar5 & 0xffff) / 3, uVar22 * 3 != uVar5)) break;
        if (2 < uVar5) {
          uVar20 = 0;
          do {
            iVar7 = get8(&z->s);
            auStack_438[uVar20 * 4] = (uint8)iVar7;
            iVar7 = get8(&z->s);
            auStack_438[uVar20 * 4 + 1] = (uint8)iVar7;
            iVar7 = get8(&z->s);
            auStack_438[uVar20 * 4 + 2] = (uint8)iVar7;
            auStack_438[uVar20 * 4 + 3] = 0xff;
            uVar20 = uVar20 + 1;
          } while (uVar22 != uVar20);
        }
      }
      else {
        if (uVar8 != 0x74524e53) goto LAB_00156af2;
        if (z->idata != (uint8 *)0x0) break;
        if ((char)uVar27 == '\0') {
          uVar8 = (z->s).img_n;
          if (((uVar8 & 1) == 0) || (uVar8 * 2 != uVar5)) break;
          uVar11 = (uint7)(uint3)(uVar8 >> 8);
          if ((int)uVar8 < 1) {
            local_480 = CONCAT71(uVar11,1);
          }
          else {
            local_480 = CONCAT71(uVar11,1);
            lVar26 = 0;
            do {
              get8(&z->s);
              iVar7 = get8(&z->s);
              local_4a3[lVar26] = (uint8)iVar7;
              lVar26 = lVar26 + 1;
            } while (lVar26 < (z->s).img_n);
          }
          uVar27 = 0;
        }
        else {
          if ((uVar22 == 0) || (uVar22 < uVar5)) break;
          uVar27 = 4;
          if (uVar20 != 0) {
            uVar28 = 0;
            do {
              iVar7 = get8(&z->s);
              auStack_438[(uVar28 & 0xffffffff) + 3] = (uint8)iVar7;
              uVar28 = uVar28 + 4;
            } while (uVar20 << 2 != uVar28);
          }
        }
      }
      get32(&z->s);
      uVar5 = get32(&z->s);
      uVar8 = get32(&z->s);
      bVar29 = false;
    } while( true );
  }
  failure_reason = "Corrupt PNG";
  return 0;
}

Assistant:

static int parse_png_file(png *z, int scan, int req_comp)
{
   uint8 palette[1024], pal_img_n=0;
   uint8 has_trans=0, tc[3];
   uint32 ioff=0, idata_limit=0, i, pal_len=0;
   int first=1,k;
   stbi *s = &z->s;

   if (!check_png_header(s)) return 0;

   if (scan == SCAN_type) return 1;

   for(;;first=0) {
      chunk c = get_chunk_header(s);
      if (first && c.type != PNG_TYPE('I','H','D','R'))
         return e("first not IHDR","Corrupt PNG");
      switch (c.type) {
         case PNG_TYPE('I','H','D','R'): {
            int depth,color,interlace,comp,filter;
            if (!first) return e("multiple IHDR","Corrupt PNG");
            if (c.length != 13) return e("bad IHDR len","Corrupt PNG");
            s->img_x = get32(s); if (s->img_x > (1 << 24)) return e("too large","Very large image (corrupt?)");
            s->img_y = get32(s); if (s->img_y > (1 << 24)) return e("too large","Very large image (corrupt?)");
            depth = get8(s);  if (depth != 8)        return e("8bit only","PNG not supported: 8-bit only");
            color = get8(s);  if (color > 6)         return e("bad ctype","Corrupt PNG");
            if (color == 3) pal_img_n = 3; else if (color & 1) return e("bad ctype","Corrupt PNG");
            comp  = get8(s);  if (comp) return e("bad comp method","Corrupt PNG");
            filter= get8(s);  if (filter) return e("bad filter method","Corrupt PNG");
            interlace = get8(s); if (interlace) return e("interlaced","PNG not supported: interlaced mode");
            if (!s->img_x || !s->img_y) return e("0-pixel image","Corrupt PNG");
            if (!pal_img_n) {
               s->img_n = (color & 2 ? 3 : 1) + (color & 4 ? 1 : 0);
               if ((1 << 30) / s->img_x / s->img_n < s->img_y) return e("too large", "Image too large to decode");
               if (scan == SCAN_header) return 1;
            } else {
               // if paletted, then pal_n is our final components, and
               // img_n is # components to decompress/filter.
               s->img_n = 1;
               if ((1 << 30) / s->img_x / 4 < s->img_y) return e("too large","Corrupt PNG");
               // if SCAN_header, have to scan to see if we have a tRNS
            }
            break;
         }

         case PNG_TYPE('P','L','T','E'):  {
            if (c.length > 256*3) return e("invalid PLTE","Corrupt PNG");
            pal_len = c.length / 3;
            if (pal_len * 3 != c.length) return e("invalid PLTE","Corrupt PNG");
            for (i=0; i < pal_len; ++i) {
               palette[i*4+0] = get8u(s);
               palette[i*4+1] = get8u(s);
               palette[i*4+2] = get8u(s);
               palette[i*4+3] = 255;
            }
            break;
         }

         case PNG_TYPE('t','R','N','S'): {
            if (z->idata) return e("tRNS after IDAT","Corrupt PNG");
            if (pal_img_n) {
               if (scan == SCAN_header) { s->img_n = 4; return 1; }
               if (pal_len == 0) return e("tRNS before PLTE","Corrupt PNG");
               if (c.length > pal_len) return e("bad tRNS len","Corrupt PNG");
               pal_img_n = 4;
               for (i=0; i < c.length; ++i)
                  palette[i*4+3] = get8u(s);
            } else {
               if (!(s->img_n & 1)) return e("tRNS with alpha","Corrupt PNG");
               if (c.length != (uint32) s->img_n*2) return e("bad tRNS len","Corrupt PNG");
               has_trans = 1;
               for (k=0; k < s->img_n; ++k)
                  tc[k] = (uint8) get16(s); // non 8-bit images will be larger
            }
            break;
         }

         case PNG_TYPE('I','D','A','T'): {
            if (pal_img_n && !pal_len) return e("no PLTE","Corrupt PNG");
            if (scan == SCAN_header) { s->img_n = pal_img_n; return 1; }
            if (ioff + c.length > idata_limit) {
               uint8 *p;
               if (idata_limit == 0) idata_limit = c.length > 4096 ? c.length : 4096;
               while (ioff + c.length > idata_limit)
                  idata_limit *= 2;
               p = (uint8 *) realloc(z->idata, idata_limit); if (p == NULL) return e("outofmem", "Out of memory");
               z->idata = p;
            }
            #ifndef STBI_NO_STDIO
            if (s->img_file)
            {
               if (fread(z->idata+ioff,1,c.length,s->img_file) != c.length) return e("outofdata","Corrupt PNG");
            }
            else
            #endif
            {
               memcpy(z->idata+ioff, s->img_buffer, c.length);
               s->img_buffer += c.length;
            }
            ioff += c.length;
            break;
         }

         case PNG_TYPE('I','E','N','D'): {
            uint32 raw_len;
            if (scan != SCAN_load) return 1;
            if (z->idata == NULL) return e("no IDAT","Corrupt PNG");
            z->expanded = (uint8 *) stbi_zlib_decode_malloc((char *) z->idata, ioff, (int *) &raw_len);
            if (z->expanded == NULL) return 0; // zlib should set error
            free(z->idata); z->idata = NULL;
            if ((req_comp == s->img_n+1 && req_comp != 3 && !pal_img_n) || has_trans)
               s->img_out_n = s->img_n+1;
            else
               s->img_out_n = s->img_n;
            if (!create_png_image(z, z->expanded, raw_len, s->img_out_n)) return 0;
            if (has_trans)
               if (!compute_transparency(z, tc, s->img_out_n)) return 0;
            if (pal_img_n) {
               // pal_img_n == 3 or 4
               s->img_n = pal_img_n; // record the actual colors we had
               s->img_out_n = pal_img_n;
               if (req_comp >= 3) s->img_out_n = req_comp;
               if (!expand_palette(z, palette, pal_len, s->img_out_n))
                  return 0;
            }
            free(z->expanded); z->expanded = NULL;
            return 1;
         }

         default:
            // if critical, fail
            if ((c.type & (1 << 29)) == 0) {
               #ifndef STBI_NO_FAILURE_STRINGS
               // not threadsafe
               static char invalid_chunk[] = "XXXX chunk not known";
               invalid_chunk[0] = (uint8) (c.type >> 24);
               invalid_chunk[1] = (uint8) (c.type >> 16);
               invalid_chunk[2] = (uint8) (c.type >>  8);
               invalid_chunk[3] = (uint8) (c.type >>  0);
               #endif
               return e(invalid_chunk, "PNG not supported: unknown chunk type");
            }
            skip(s, c.length);
            break;
      }
      // end of chunk, read and skip CRC
      get32(s);
   }
}